

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles3::Functional::TextureSizeCase::genFragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,TextureSizeCase *this)

{
  size_t sVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  bool bVar5;
  ostringstream frag;
  undefined1 auStack_198 [8];
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
  if (this->m_isVertexCase == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"in mediump vec4 v_color;\n",0x19);
  }
  if (this->m_isVertexCase == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"uniform highp ",0xe);
    pcVar4 = this->m_samplerTypeStr;
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)(auStack_198 + (long)*(_func_int **)(local_190._0_8_ + -0x18)) + 8);
    }
    else {
      sVar1 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar4,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," u_sampler;\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"uniform highp ivec",0x12);
    poVar2 = (ostream *)std::ostream::operator<<(local_190,this->m_has3DSize | 2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," u_texSize;\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"uniform highp int u_lod;\n",0x19);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"void main()\n{\n",0xe);
  pcVar4 = 
  "\to_color = (textureSize(u_sampler, u_lod) == u_texSize ? vec4(1.0, 1.0, 1.0, 1.0) : vec4(0.0, 0.0, 0.0, 1.0));\n"
  ;
  bVar5 = this->m_isVertexCase != false;
  if (bVar5) {
    pcVar4 = "\to_color = v_color;\n";
  }
  lVar3 = 0x6f;
  if (bVar5) {
    lVar3 = 0x14;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar4,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string TextureSizeCase::genFragmentShader() const
{
	std::ostringstream	frag;

	frag << "#version 300 es\n"
			<< "layout(location = 0) out mediump vec4 o_color;\n";

	if (m_isVertexCase)
			frag << "in mediump vec4 v_color;\n";

	if (!m_isVertexCase)
	{
		frag << "uniform highp " << m_samplerTypeStr << " u_sampler;\n";
		frag << "uniform highp ivec" << (m_has3DSize ? 3 : 2) << " u_texSize;\n";
		frag << "uniform highp int u_lod;\n";
	}

	frag << "void main()\n{\n";

	if (!m_isVertexCase)
		frag << "	o_color = (textureSize(u_sampler, u_lod) == u_texSize ? vec4(1.0, 1.0, 1.0, 1.0) : vec4(0.0, 0.0, 0.0, 1.0));\n";
	else
		frag << "	o_color = v_color;\n";

	frag << "}\n";

	return frag.str();
}